

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O3

Expression __thiscall cnn::LSTMBuilder::add_input_impl(LSTMBuilder *this,int prev,Expression *x)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  undefined8 *puVar4;
  LSTMBuilder *pLVar5;
  undefined8 *in_RCX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  long *plVar6;
  ulong uVar8;
  undefined4 in_register_00000034;
  long *plVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double __x;
  double __x_00;
  double __x_01;
  Expression EVar13;
  Expression in;
  Expression i_aot;
  Expression i_ot;
  Expression ph_t;
  Expression i_awt;
  Expression i_ft;
  Expression i_wt;
  Expression i_it;
  Expression local_1b8;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  long local_198;
  uint local_18c;
  ulong local_188;
  undefined8 local_180;
  ComputationGraph local_178;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  ComputationGraph *local_118;
  uint local_110;
  long local_108;
  long local_100;
  initializer_list<cnn::expr::Expression> local_f8;
  Expression local_e8;
  ComputationGraph *local_d8;
  uint local_d0;
  initializer_list<cnn::expr::Expression> local_c8;
  Expression local_b8;
  LSTMBuilder *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  Expression local_88;
  Expression local_78;
  Expression local_68;
  long *local_58;
  long *local_50;
  long local_48;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_40;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_38;
  ulong uVar7;
  
  lVar10 = CONCAT44(in_register_00000034,prev);
  local_18c = (uint)x;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_178,
             (ulong)*(uint *)(lVar10 + 0xc0),(allocator_type *)&local_1b8);
  local_38 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar10 + 0x58);
  local_108 = lVar10;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_38,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_178);
  if ((ComputationGraph *)
      local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  lVar10 = local_108;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_178,
             (ulong)*(uint *)(local_108 + 0xc0),(allocator_type *)&local_1b8);
  local_40 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar10 + 0x70);
  local_a8 = this;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_40,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_178);
  uVar7 = extraout_RDX;
  if ((ComputationGraph *)
      local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar7 = extraout_RDX_00;
  }
  local_a0 = *(long *)(local_108 + 0x60);
  local_1b8.pg = (ComputationGraph *)*in_RCX;
  local_1b8.i.t = *(uint *)(in_RCX + 1);
  if (*(int *)(local_108 + 0xc0) != 0) {
    local_50 = (long *)(local_108 + 0x90);
    local_58 = (long *)(local_108 + 0xa8);
    lVar10 = 0;
    local_48 = (ulong)local_18c << 3;
    lVar11 = 0;
    uVar8 = 0;
    local_100 = *(long *)(local_108 + 0x78);
    do {
      lVar3 = *(long *)(local_108 + 0x40);
      local_b8.pg = (ComputationGraph *)0x0;
      local_b8.i.t = 0;
      bVar2 = *(byte *)(local_108 + 0x88);
      bVar12 = (int)local_18c < 0;
      if (bVar12) {
        plVar6 = local_58;
        plVar9 = local_50;
        if ((bVar2 & 1) != 0) goto LAB_001983b1;
        local_188 = 0;
        local_180 = 0;
      }
      else {
        plVar6 = (long *)(local_48 * 3 + *(long *)local_40);
        plVar9 = (long *)(*(long *)local_38 + local_48 * 3);
LAB_001983b1:
        local_180 = *(undefined8 *)(*plVar9 + lVar11);
        local_188 = (ulong)*(uint *)(*plVar9 + 8 + lVar11);
        local_b8.pg = *(ComputationGraph **)(*plVar6 + lVar11);
        local_b8.i.t = *(uint *)(*plVar6 + 8 + lVar11);
      }
      fVar1 = *(float *)(local_108 + 0xc4);
      local_198 = lVar10;
      local_90 = uVar8;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        expr::dropout((expr *)&local_178,&local_1b8,fVar1);
        local_1b8.pg = (ComputationGraph *)
                       local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_1b8.i.t =
             (uint)local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      local_68.pg = (ComputationGraph *)0x0;
      local_68.i.t = 0;
      if (bVar12 && (bVar2 & 1) == 0) {
        puVar4 = *(undefined8 **)(lVar3 + local_198);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar4[6];
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar4 + 7);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar4 + 1);
        local_c8._M_len = 3;
      }
      else {
        puVar4 = *(undefined8 **)(lVar3 + local_198);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar4[6];
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar4 + 7);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar4 + 1);
        local_178.ee = (ExecutionEngine *)puVar4[2];
        local_140 = *(undefined4 *)(puVar4 + 3);
        local_138 = local_180;
        local_130 = (undefined4)local_188;
        local_128 = puVar4[4];
        local_120 = *(undefined4 *)(puVar4 + 5);
        local_118 = local_b8.pg;
        local_110 = local_b8.i.t;
        local_c8._M_len = 7;
      }
      local_178.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
      local_178.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
      local_c8._M_array = (iterator)&local_178;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_78,&local_c8);
      local_68.pg = local_78.pg;
      local_68.i.t = local_78.i.t;
      expr::logistic((expr *)&local_78,&local_68);
      expr::operator-((expr *)&local_c8,1.0,&local_78);
      lVar10 = local_198;
      local_d8 = (ComputationGraph *)0x0;
      local_d0 = 0;
      local_1a8 = (undefined1  [8])&local_178;
      local_98 = lVar3;
      if (bVar12 && (bVar2 & 1) == 0) {
        lVar3 = *(long *)(lVar3 + local_198);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0xa0);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar3 + 0xa8);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x80);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x88);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
        local_1a0 = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_88,(initializer_list<cnn::expr::Expression> *)local_1a8);
        local_d8 = local_88.pg;
        local_d0 = local_88.i.t;
        expr::tanh((expr *)&local_88,__x_00);
        expr::cwise_multiply((expr *)&local_178,&local_78,&local_88);
        lVar3 = *(long *)(local_100 + -0x18);
        *(pointer *)(lVar3 + lVar11) =
             local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(uint *)(lVar3 + 8 + lVar11) =
             (uint)local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        lVar10 = *(long *)(local_98 + lVar10);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar10 + 0x70);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar10 + 0x78);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar10 + 0x40);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar10 + 0x48);
        local_f8._M_len = 3;
      }
      else {
        lVar3 = *(long *)(lVar3 + local_198);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0xa0);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar3 + 0xa8);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x80);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x88);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
        local_178.ee = *(ExecutionEngine **)(lVar3 + 0x90);
        local_140 = *(undefined4 *)(lVar3 + 0x98);
        local_138 = local_180;
        local_130 = (undefined4)local_188;
        local_1a0 = 5;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_88,(initializer_list<cnn::expr::Expression> *)local_1a8);
        local_d8 = local_88.pg;
        local_d0 = local_88.i.t;
        expr::tanh((expr *)&local_88,__x);
        expr::cwise_multiply((expr *)&local_178,&local_78,&local_88);
        expr::cwise_multiply((expr *)local_1a8,(Expression *)&local_c8,&local_b8);
        expr::operator+((expr *)&local_e8,(Expression *)local_1a8,(Expression *)&local_178);
        lVar3 = *(long *)(local_100 + -0x18);
        *(ComputationGraph **)(lVar3 + lVar11) = local_e8.pg;
        *(uint *)(lVar3 + 8 + lVar11) = local_e8.i.t;
        lVar10 = *(long *)(local_98 + lVar10);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar10 + 0x70);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar10 + 0x78);
        local_178.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar10 + 0x40);
        local_178.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar10 + 0x48);
        local_178.ee = *(ExecutionEngine **)(lVar10 + 0x50);
        local_140 = *(undefined4 *)(lVar10 + 0x58);
        local_138 = local_180;
        local_130 = (undefined4)local_188;
        local_128 = *(undefined8 *)(lVar10 + 0x60);
        local_120 = *(undefined4 *)(lVar10 + 0x68);
        local_118 = *(ComputationGraph **)(lVar3 + lVar11);
        local_110 = *(uint *)(lVar3 + 8 + lVar11);
        local_f8._M_len = 7;
      }
      local_1a0 = local_1a0 & 0xffffffff00000000;
      local_1a8 = (undefined1  [8])0x0;
      local_178.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
      local_178.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
      local_f8._M_array = (iterator)&local_178;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_e8,&local_f8);
      uVar8 = local_90;
      local_1a8 = (undefined1  [8])local_e8.pg;
      local_1a0 = CONCAT44(local_1a0._4_4_,local_e8.i.t);
      expr::logistic((expr *)&local_178,(Expression *)local_1a8);
      expr::tanh((expr *)&local_e8,__x_01);
      expr::cwise_multiply((expr *)&local_f8,(Expression *)&local_178,&local_e8);
      lVar10 = *(long *)(local_a0 + -0x18);
      *(iterator *)(lVar10 + lVar11) = local_f8._M_array;
      *(uint *)(lVar10 + 8 + lVar11) = (uint)local_f8._M_len;
      local_1b8.pg = (ComputationGraph *)local_f8._M_array;
      local_1b8.i.t = (uint)local_f8._M_len;
      uVar8 = uVar8 + 1;
      uVar7 = (ulong)*(uint *)(local_108 + 0xc0);
      lVar11 = lVar11 + 0x10;
      lVar10 = local_198 + 0x18;
    } while (uVar8 < uVar7);
  }
  pLVar5 = local_a8;
  fVar1 = *(float *)(local_108 + 0xc4);
  lVar10 = *(long *)(local_a0 + -0x10);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    EVar13 = expr::dropout((expr *)local_a8,(Expression *)(lVar10 + -0x10),fVar1);
    uVar7 = EVar13._8_8_;
  }
  else {
    (local_a8->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar10 + -0x10);
    (local_a8->super_RNNBuilder).cur.t = *(int *)(lVar10 + -8);
  }
  EVar13._8_8_ = uVar7;
  EVar13.pg = (ComputationGraph *)pLVar5;
  return EVar13;
}

Assistant:

Expression LSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // apply dropout according to http://arxiv.org/pdf/1409.2329v5.pdf
    if (dropout_rate) in = dropout(in, dropout_rate);
    // input
    Expression i_ait;
    if (has_prev_state)
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
    else return ht.back();
}